

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptError.cpp
# Opt level: O2

Var Js::JavascriptError::EntryToString(RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  CallInfo CVar4;
  bool bVar5;
  BOOL BVar6;
  charcount_t cVar7;
  charcount_t cVar8;
  undefined4 *puVar9;
  Var pvVar10;
  RecyclableObject *pRVar11;
  RecyclableObject *this;
  JavascriptString *pJVar12;
  JavascriptString *this_00;
  JavascriptString *pstRight;
  int in_stack_00000010;
  undefined1 local_50 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  Var value;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptError.cpp"
                                ,0xbc,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) goto LAB_00a80858;
    *puVar9 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_50,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((local_50._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptError.cpp"
                                ,0xbf,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar5) goto LAB_00a80858;
    *puVar9 = 0;
  }
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptError.cpp"
                                ,0xc1,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar5) goto LAB_00a80858;
    *puVar9 = 0;
  }
  pvVar10 = Arguments::operator[]((Arguments *)local_50,0);
  if (pvVar10 == (Var)0x0) {
LAB_00a8085a:
    ThrowTypeError(pSVar2,-0x7ff5ec41,L"Error.prototype.toString");
  }
  pvVar10 = Arguments::operator[]((Arguments *)local_50,0);
  BVar6 = JavascriptOperators::IsObject(pvVar10);
  if (BVar6 == 0) goto LAB_00a8085a;
  pvVar10 = Arguments::operator[]((Arguments *)local_50,0);
  pRVar11 = VarTo<Js::RecyclableObject>(pvVar10);
  callInfo_local = (CallInfo)0x0;
  BVar6 = JavascriptOperators::GetPropertyNoCache(pRVar11,0x106,(Var *)&callInfo_local,pSVar2);
  CVar4 = callInfo_local;
  if (BVar6 == 0) {
LAB_00a8060e:
    pJVar12 = JavascriptLibrary::CreateStringFromCppLiteral<6ul>
                        ((pSVar2->super_ScriptContextBase).javascriptLibrary,
                         (char16 (*) [6])0xfcae92);
  }
  else {
    if (callInfo_local == (CallInfo)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_00a80858;
      *puVar9 = 0;
    }
    bVar5 = TaggedInt::Is((Var)CVar4);
    if ((ulong)CVar4 < 0x4000000000000 && !bVar5) {
      this = UnsafeVarTo<Js::RecyclableObject>((Var)CVar4);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar5) goto LAB_00a80858;
        *puVar9 = 0;
      }
      TVar1 = ((this->type).ptr)->typeId;
      if ((int)TVar1 < 0x58) {
        if (TVar1 == TypeIds_Undefined) goto LAB_00a8060e;
      }
      else {
        BVar6 = RecyclableObject::IsExternal(this);
        if (BVar6 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar5) goto LAB_00a80858;
          *puVar9 = 0;
        }
      }
    }
    pJVar12 = JavascriptConversion::ToString((Var)callInfo_local,pSVar2);
  }
  BVar6 = JavascriptOperators::GetPropertyNoCache(pRVar11,0x102,(Var *)&callInfo_local,pSVar2);
  CVar4 = callInfo_local;
  if (BVar6 == 0) {
LAB_00a80787:
    this_00 = JavascriptLibrary::GetEmptyString((pSVar2->super_ScriptContextBase).javascriptLibrary)
    ;
  }
  else {
    if (callInfo_local == (CallInfo)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_00a80858;
      *puVar9 = 0;
    }
    bVar5 = TaggedInt::Is((Var)CVar4);
    if ((ulong)CVar4 < 0x4000000000000 && !bVar5) {
      pRVar11 = UnsafeVarTo<Js::RecyclableObject>((Var)CVar4);
      if (pRVar11 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar5) goto LAB_00a80858;
        *puVar9 = 0;
      }
      TVar1 = ((pRVar11->type).ptr)->typeId;
      if ((int)TVar1 < 0x58) {
        if (TVar1 == TypeIds_Undefined) goto LAB_00a80787;
      }
      else {
        BVar6 = RecyclableObject::IsExternal(pRVar11);
        if (BVar6 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar5) {
LAB_00a80858:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar9 = 0;
        }
      }
    }
    this_00 = JavascriptConversion::ToString((Var)callInfo_local,pSVar2);
  }
  cVar7 = JavascriptString::GetLength(pJVar12);
  cVar8 = JavascriptString::GetLength(this_00);
  if ((cVar7 == 0) || (cVar8 == 0)) {
    if (cVar8 != 0) {
      pJVar12 = this_00;
    }
  }
  else {
    pstRight = JavascriptLibrary::CreateStringFromCppLiteral<3ul>
                         ((pSVar2->super_ScriptContextBase).javascriptLibrary,
                          (char16 (*) [3])0xe98902);
    pJVar12 = JavascriptString::Concat(pJVar12,pstRight);
    pJVar12 = JavascriptString::Concat(pJVar12,this_00);
  }
  return pJVar12;
}

Assistant:

Var JavascriptError::EntryToString(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args[0] == 0 || !JavascriptOperators::IsObject(args[0]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedObject, _u("Error.prototype.toString"));
        }

        RecyclableObject* thisError = VarTo<RecyclableObject>(args[0]);
        Var value = NULL;
        JavascriptString *outputStr, *message;

        // get error.name
        BOOL hasName = JavascriptOperators::GetPropertyNoCache(thisError, PropertyIds::name, &value, scriptContext) &&
            JavascriptOperators::GetTypeId(value) != TypeIds_Undefined;

        if (hasName)
        {
            outputStr = JavascriptConversion::ToString(value, scriptContext);
        }
        else
        {
            outputStr = scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("Error"));
        }

        // get error.message
        if (JavascriptOperators::GetPropertyNoCache(thisError, PropertyIds::message, &value, scriptContext)
            && JavascriptOperators::GetTypeId(value) != TypeIds_Undefined)
        {
            message = JavascriptConversion::ToString(value, scriptContext);
        }
        else
        {
            message = scriptContext->GetLibrary()->GetEmptyString();
        }

        charcount_t nameLen = outputStr->GetLength();
        charcount_t msgLen = message->GetLength();

        if (nameLen > 0 && msgLen > 0)
        {
            outputStr = JavascriptString::Concat(outputStr, scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u(": ")));
            outputStr = JavascriptString::Concat(outputStr, message);
        }
        else if (msgLen > 0)
        {
            outputStr = message;
        }

        return outputStr;
    }